

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::ReportInvalidTestSuiteType
               (char *test_suite_name,CodeLocation *code_location)

{
  size_t sVar1;
  ostream *poVar2;
  int line;
  char *pcVar3;
  GTestLog local_6c;
  string local_68;
  string local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  
  Message::Message((Message *)&local_28);
  poVar2 = (ostream *)(local_28._M_head_impl + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Attempted redefinition of test suite ",0x25);
  if (test_suite_name == (char *)0x0) {
    sVar1 = 6;
    pcVar3 = "(null)";
  }
  else {
    sVar1 = strlen(test_suite_name);
    pcVar3 = test_suite_name;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"All tests in the same test suite must use the same test fixture\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"class.  However, in test suite ",0x1f);
  if (test_suite_name == (char *)0x0) {
    sVar1 = 6;
    test_suite_name = "(null)";
  }
  else {
    sVar1 = strlen(test_suite_name);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,test_suite_name,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", you tried\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"to define a test using a fixture class different from the one\n",0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"used earlier. This can happen if the two fixture classes are\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"from different namespaces and have the same name. You should\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"probably rename one of the classes to put the tests into different\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"test suites.",0xc);
  line = 0xadd;
  GTestLog::GTestLog(&local_6c,GTEST_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/test/googletest/googletest/src/gtest.cc"
                     ,0xadd);
  FormatFileLocation_abi_cxx11_
            (&local_48,(internal *)(code_location->file)._M_dataplus._M_p,
             (char *)(ulong)(uint)code_location->line,line);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  StringStreamToString(&local_68,local_28._M_head_impl);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  GTestLog::~GTestLog(&local_6c);
  if (local_28._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_28._M_head_impl + 8))(local_28._M_head_impl);
  }
  return;
}

Assistant:

void ReportInvalidTestSuiteType(const char* test_suite_name,
                                CodeLocation code_location) {
  Message errors;
  errors
      << "Attempted redefinition of test suite " << test_suite_name << ".\n"
      << "All tests in the same test suite must use the same test fixture\n"
      << "class.  However, in test suite " << test_suite_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test suites.";

  GTEST_LOG_(ERROR) << FormatFileLocation(code_location.file.c_str(),
                                          code_location.line)
                    << " " << errors.GetString();
}